

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaig.h
# Opt level: O0

Mini_Aig_t * Mini_AigStart(void)

{
  Mini_Aig_t *p_00;
  int *piVar1;
  Mini_Aig_t *p;
  
  p_00 = (Mini_Aig_t *)calloc(1,0x18);
  p_00->nCap = 0xff;
  piVar1 = (int *)malloc((long)p_00->nCap << 2);
  p_00->pArray = piVar1;
  Mini_AigPush(p_00,0x7fffffff,0x7fffffff);
  return p_00;
}

Assistant:

static Mini_Aig_t * Mini_AigStart()
{
    Mini_Aig_t * p;
    p = MINI_AIG_CALLOC( Mini_Aig_t, 1 );
    p->nCap   = MINI_AIG_START_SIZE;
    p->pArray = MINI_AIG_ALLOC( int, p->nCap );
    Mini_AigPush( p, MINI_AIG_NULL, MINI_AIG_NULL );
    return p;
}